

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXNodeAttribute.cpp
# Opt level: O2

void __thiscall Assimp::FBX::CameraSwitcher::~CameraSwitcher(CameraSwitcher *this)

{
  (this->super_NodeAttribute).super_Object._vptr_Object =
       (_func_int **)&PTR__CameraSwitcher_007f8b98;
  std::__cxx11::string::~string((string *)&this->cameraIndexName);
  std::__cxx11::string::~string((string *)&this->cameraName);
  LimbNode::~LimbNode((LimbNode *)this);
  return;
}

Assistant:

CameraSwitcher::~CameraSwitcher()
{
    // empty
}